

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type)

{
  bool bVar1;
  bool bVar2;
  Classifier CVar3;
  reference pvVar4;
  HorribleError *pHVar5;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar6;
  size_type remaining_args;
  App *this_01;
  reference this_02;
  pointer pOVar7;
  size_t sVar8;
  ArgumentMismatch *__return_storage_ptr__;
  ulong uVar9;
  byte local_48d;
  int local_464;
  int local_44c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_369;
  string local_368;
  string local_348;
  pointer local_328;
  string local_320;
  string local_300 [8];
  string current_;
  string local_2d8;
  pointer local_2b8;
  string local_2b0;
  pointer local_290;
  string local_288;
  pointer local_268;
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  string res;
  int local_1d8;
  int result_count;
  int collected;
  int num;
  Option_p *op;
  shared_ptr<CLI::App> *subc;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range3;
  anon_class_40_2_a297e68f_for__M_pred local_198;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_170;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_168;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_160;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string local_150;
  undefined1 local_12a;
  allocator local_129;
  string local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_a8 [8];
  string rest;
  string value;
  string arg_name;
  string current;
  Classifier current_type_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  ::std::__cxx11::string::string((string *)(arg_name.field_2._M_local_buf + 8),(string *)pvVar4);
  ::std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_a8);
  switch(current_type) {
  case NONE:
  case POSITIONAL_MARK:
  case SUBCOMMAND:
  default:
    op_ptr._M_current._6_1_ = 1;
    pHVar5 = (HorribleError *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_150,
               "parsing got called with invalid option! You should not see this",
               (allocator *)((long)&op_ptr._M_current + 7));
    HorribleError::HorribleError(pHVar5,&local_150);
    op_ptr._M_current._6_1_ = 0;
    __cxa_throw(pHVar5,&HorribleError::typeinfo,HorribleError::~HorribleError);
  case SHORT:
    bVar1 = detail::split_short((string *)((long)&arg_name.field_2 + 8),
                                (string *)((long)&value.field_2 + 8),(string *)local_a8);
    if (!bVar1) {
      local_102 = 1;
      pHVar5 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_100,"Short parsed but missing! You should not see this",&local_101
                );
      HorribleError::HorribleError(pHVar5,&local_100);
      local_102 = 0;
      __cxa_throw(pHVar5,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case LONG:
    bVar1 = detail::split_long((string *)((long)&arg_name.field_2 + 8),
                               (string *)((long)&value.field_2 + 8),
                               (string *)((long)&rest.field_2 + 8));
    if (!bVar1) {
      local_d9 = 1;
      pHVar5 = (HorribleError *)__cxa_allocate_exception(0x38);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::operator+(&local_d8,"Long parsed but missing (you should not see this):",pvVar4);
      HorribleError::HorribleError(pHVar5,&local_d8);
      local_d9 = 0;
      __cxa_throw(pHVar5,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case WINDOWS:
    bVar1 = detail::split_windows_style
                      ((string *)((long)&arg_name.field_2 + 8),(string *)((long)&value.field_2 + 8),
                       (string *)((long)&rest.field_2 + 8));
    if (!bVar1) {
      local_12a = 1;
      pHVar5 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_128,"windows option parsed but missing! You should not see this",
                 &local_129);
      HorribleError::HorribleError(pHVar5,&local_128);
      local_12a = 0;
      __cxa_throw(pHVar5,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_168._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  local_170._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  ::std::__cxx11::string::string((string *)&local_198,(string *)(value.field_2._M_local_buf + 8));
  local_198.current_type = current_type;
  local_160 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (local_168,local_170,&local_198);
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier)
  ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((_lambda_std__unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const___1_ *)
             &local_198);
  __range3 = (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  bVar1 = __gnu_cxx::operator==
                    (&local_160,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)&__range3);
  if (bVar1) {
    __end3 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
    subc = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&subc), bVar1) {
      this_00 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&__end3);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this_00);
      uVar9 = ::std::__cxx11::string::empty();
      if (((uVar9 & 1) != 0) &&
         (peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00), (peVar6->disabled_ & 1U) == 0)) {
        peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        bVar1 = _parse_arg(peVar6,args,current_type);
        if (bVar1) {
          peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00);
          if ((peVar6->pre_parse_called_ & 1U) == 0) {
            peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(this_00);
            remaining_args =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(args);
            _trigger_pre_parse(peVar6,remaining_args);
          }
          this_local._7_1_ = true;
          goto LAB_001a8f1f;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end3);
    }
    if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
      if ((this->parent_ == (App *)0x0) ||
         (uVar9 = ::std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        _move_to_missing(this,current_type,(string *)((long)&arg_name.field_2 + 8));
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_01 = _get_fallthrough_parent(this);
      this_local._7_1_ = _parse_arg(this_01,args,current_type);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    this_02 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&local_160);
    pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_02);
    result_count = Option::get_items_expected(pOVar7);
    local_1d8 = 0;
    res.field_2._12_4_ = 0;
    if (result_count == 0) {
      pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_02);
      ::std::__cxx11::string::string
                ((string *)&local_220,(string *)(value.field_2._M_local_buf + 8));
      ::std::__cxx11::string::string((string *)&local_240,(string *)(rest.field_2._M_local_buf + 8))
      ;
      Option::get_flag_value((string *)local_200,pOVar7,&local_220,&local_240);
      ::std::__cxx11::string::~string((string *)&local_240);
      ::std::__cxx11::string::~string((string *)&local_220);
      pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_02);
      ::std::__cxx11::string::string((string *)&local_260,(string *)local_200);
      Option::add_result(pOVar7,&local_260);
      ::std::__cxx11::string::~string((string *)&local_260);
      local_268 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(this_02);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_268);
      ::std::__cxx11::string::~string((string *)local_200);
    }
    else {
      uVar9 = ::std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_02);
        ::std::__cxx11::string::string
                  ((string *)&local_288,(string *)(rest.field_2._M_local_buf + 8));
        Option::add_result(pOVar7,&local_288,(int *)(res.field_2._M_local_buf + 0xc));
        ::std::__cxx11::string::~string((string *)&local_288);
        local_290 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(this_02);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,&local_290);
        local_1d8 = res.field_2._12_4_;
        if (0 < result_count) {
          if (result_count < (int)res.field_2._12_4_) {
            local_44c = 0;
          }
          else {
            local_44c = result_count - res.field_2._12_4_;
          }
          result_count = local_44c;
        }
      }
      else {
        uVar9 = ::std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (this_02);
          ::std::__cxx11::string::string((string *)&local_2b0,(string *)local_a8);
          Option::add_result(pOVar7,&local_2b0,(int *)(res.field_2._M_local_buf + 0xc));
          ::std::__cxx11::string::~string((string *)&local_2b0);
          local_2b8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(this_02);
          std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                    (&this->parse_order_,&local_2b8);
          ::std::__cxx11::string::operator=((string *)local_a8,"");
          local_1d8 = res.field_2._12_4_;
          if (0 < result_count) {
            if (result_count < (int)res.field_2._12_4_) {
              local_464 = 0;
            }
            else {
              local_464 = result_count - res.field_2._12_4_;
            }
            result_count = local_464;
          }
        }
      }
    }
    if (result_count < 0) {
      while( true ) {
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(args);
        bVar1 = false;
        if (!bVar2) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(args);
          CVar3 = _recognize(this,pvVar4,false);
          bVar1 = CVar3 == NONE;
        }
        if ((!bVar1) ||
           ((SBORROW4(local_1d8,-result_count) == local_1d8 + result_count < 0 &&
            (sVar8 = _count_remaining_positionals(this,false), sVar8 != 0)))) break;
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_02);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(args);
        ::std::__cxx11::string::string((string *)&local_2d8,(string *)pvVar4);
        Option::add_result(pOVar7,&local_2d8,(int *)(res.field_2._M_local_buf + 0xc));
        ::std::__cxx11::string::~string((string *)&local_2d8);
        current_.field_2._8_8_ =
             std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(this_02);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,(value_type *)((long)&current_.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        local_1d8 = res.field_2._12_4_ + local_1d8;
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(args);
      if (!bVar1) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(args);
        CVar3 = _recognize(this,pvVar4,true);
        if (CVar3 == POSITIONAL_MARK) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
        }
      }
    }
    else {
      while( true ) {
        local_48d = 0;
        if (0 < result_count) {
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(args);
          local_48d = bVar1 ^ 0xff;
        }
        if ((local_48d & 1) == 0) break;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(args);
        ::std::__cxx11::string::string(local_300,(string *)pvVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_02);
        ::std::__cxx11::string::string((string *)&local_320,local_300);
        Option::add_result(pOVar7,&local_320,(int *)(res.field_2._M_local_buf + 0xc));
        ::std::__cxx11::string::~string((string *)&local_320);
        local_328 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(this_02);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,&local_328);
        result_count = result_count - res.field_2._12_4_;
        ::std::__cxx11::string::~string(local_300);
      }
      if (0 < result_count) {
        local_369 = 1;
        __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_02);
        Option::get_name_abi_cxx11_(&local_348,pOVar7,false,false);
        pOVar7 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_02);
        Option::get_type_name_abi_cxx11_(&local_368,pOVar7);
        ArgumentMismatch::TypedAtLeast(__return_storage_ptr__,&local_348,result_count,&local_368);
        local_369 = 0;
        __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,
                    ArgumentMismatch::~ArgumentMismatch);
      }
    }
    uVar9 = ::std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      ::std::operator+(&local_390,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
      ::std::__cxx11::string::operator=((string *)local_a8,(string *)&local_390);
      ::std::__cxx11::string::~string((string *)&local_390);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,(value_type *)local_a8);
    }
    this_local._7_1_ = true;
  }
LAB_001a8f1f:
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(arg_name.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool _parse_arg(std::vector<std::string> &args, detail::Classifier current_type) {

        std::string current = args.back();

        std::string arg_name;
        std::string value;
        std::string rest;

        switch(current_type) {
        case detail::Classifier::LONG:
            if(!detail::split_long(current, arg_name, value))
                throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
            break;
        case detail::Classifier::SHORT:
            if(!detail::split_short(current, arg_name, rest))
                throw HorribleError("Short parsed but missing! You should not see this");
            break;
        case detail::Classifier::WINDOWS:
            if(!detail::split_windows_style(current, arg_name, value))
                throw HorribleError("windows option parsed but missing! You should not see this");
            break;
        case detail::Classifier::SUBCOMMAND:
        case detail::Classifier::POSITIONAL_MARK:
        case detail::Classifier::NONE:
        default:
            throw HorribleError("parsing got called with invalid option! You should not see this");
        }

        auto op_ptr =
            std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
                if(current_type == detail::Classifier::LONG)
                    return opt->check_lname(arg_name);
                if(current_type == detail::Classifier::SHORT)
                    return opt->check_sname(arg_name);
                // this will only get called for detail::Classifier::WINDOWS
                return opt->check_lname(arg_name) || opt->check_sname(arg_name);
            });

        // Option not found
        if(op_ptr == std::end(options_)) {
            for(auto &subc : subcommands_) {
                if(subc->name_.empty() && !subc->disabled_) {
                    if(subc->_parse_arg(args, current_type)) {
                        if(!subc->pre_parse_called_) {
                            subc->_trigger_pre_parse(args.size());
                        }
                        return true;
                    }
                }
            }
            // If a subcommand, try the master command
            if(parent_ != nullptr && fallthrough_)
                return _get_fallthrough_parent()->_parse_arg(args, current_type);
            // don't capture missing if this is a nameless subcommand
            if(parent_ != nullptr && name_.empty()) {
                return false;
            }
            // Otherwise, add to missing
            args.pop_back();
            _move_to_missing(current_type, current);
            return true;
        }

        args.pop_back();

        // Get a reference to the pointer to make syntax bearable
        Option_p &op = *op_ptr;

        int num = op->get_items_expected();

        // Make sure we always eat the minimum for unlimited vectors
        int collected = 0;
        int result_count = 0;
        // deal with flag like things
        if(num == 0) {
            auto res = op->get_flag_value(arg_name, value);
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
        // --this=value
        else if(!value.empty()) {
            op->add_result(value, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
            // If exact number expected
            if(num > 0)
                num = (num >= result_count) ? num - result_count : 0;

            // -Trest
        } else if(!rest.empty()) {
            op->add_result(rest, result_count);
            parse_order_.push_back(op.get());
            rest = "";
            collected += result_count;
            // If exact number expected
            if(num > 0)
                num = (num >= result_count) ? num - result_count : 0;
        }

        // Unlimited vector parser
        if(num < 0) {
            while(!args.empty() && _recognize(args.back(), false) == detail::Classifier::NONE) {
                if(collected >= -num) {
                    // We could break here for allow extras, but we don't

                    // If any positionals remain, don't keep eating
                    if(_count_remaining_positionals() > 0)
                        break;
                }
                op->add_result(args.back(), result_count);
                parse_order_.push_back(op.get());
                args.pop_back();
                collected += result_count;
            }

            // Allow -- to end an unlimited list and "eat" it
            if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
                args.pop_back();

        } else {
            while(num > 0 && !args.empty()) {
                std::string current_ = args.back();
                args.pop_back();
                op->add_result(current_, result_count);
                parse_order_.push_back(op.get());
                num -= result_count;
            }

            if(num > 0) {
                throw ArgumentMismatch::TypedAtLeast(op->get_name(), num, op->get_type_name());
            }
        }

        if(!rest.empty()) {
            rest = "-" + rest;
            args.push_back(rest);
        }
        return true;
    }